

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O3

MPP_RET mpp_packet_add_segment_info(MppPacket packet,RK_S32 type,RK_S32 offset,RK_S32 len)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  long *plVar7;
  MPP_RET MVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar3 = *(uint *)((long)packet + 0x58);
  uVar9 = (ulong)uVar3;
  uVar10 = *(uint *)((long)packet + 0x5c);
  if (uVar3 < uVar10) {
    pvVar4 = *(void **)((long)packet + 0x128);
    if (pvVar4 == (void *)0x0) {
      pvVar4 = (void *)((long)packet + 0x60);
      *(void **)((long)packet + 0x128) = pvVar4;
    }
LAB_001350ad:
    *(uint *)((long)pvVar4 + uVar9 * 0x18) = uVar3;
    *(RK_S32 *)((long)pvVar4 + uVar9 * 0x18 + 4) = type;
    *(RK_S32 *)((long)pvVar4 + uVar9 * 0x18 + 8) = offset;
    *(RK_S32 *)((long)pvVar4 + uVar9 * 0x18 + 0xc) = len;
    *(undefined8 *)((long)pvVar4 + uVar9 * 0x18 + 0x10) = 0;
    if (uVar3 != 0) {
      pvVar4 = (void *)((long)pvVar4 + uVar9 * 0x18);
      *(void **)((long)pvVar4 + -8) = pvVar4;
    }
    uVar3 = *(int *)((long)packet + 0x58) + 1;
    *(uint *)((long)packet + 0x58) = uVar3;
    MVar8 = MPP_OK;
    if (uVar10 < uVar3) {
      MVar8 = MPP_OK;
      _mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "p->segment_nb <= p->segment_buf_cnt","mpp_packet_add_segment_info",0x22b);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
  }
  else {
    uVar10 = uVar10 * 2;
    if (*(void **)((long)packet + 0x120) == (void *)0x0) {
      pvVar4 = mpp_osal_calloc("mpp_packet_add_segment_info",(ulong)uVar10 * 0x18);
      if (pvVar4 != (void *)0x0) {
        memcpy(pvVar4,(void *)((long)packet + 0x60),0xc0);
        goto LAB_00134fd6;
      }
    }
    else {
      pvVar4 = mpp_osal_realloc("mpp_packet_add_segment_info",*(void **)((long)packet + 0x120),
                                (ulong)uVar10 * 0x18);
      if (pvVar4 != (void *)0x0) {
LAB_00134fd6:
        auVar1 = _DAT_00150cf0;
        uVar2 = uVar3 - 1;
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2 + 1 & 0xfffffffffffffffe;
          lVar6 = (ulong)uVar2 - 1;
          auVar11._8_4_ = (int)lVar6;
          auVar11._0_8_ = lVar6;
          auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
          plVar7 = (long *)((long)pvVar4 + 0x28);
          auVar11 = auVar11 ^ _DAT_00150cf0;
          auVar12 = _DAT_00148ee0;
          do {
            auVar13 = auVar12 ^ auVar1;
            lVar6 = auVar12._8_8_;
            if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                        auVar11._4_4_ < auVar13._4_4_) & 1)) {
              plVar7[-3] = (long)((long)pvVar4 + (auVar12._0_8_ + 1) * 0x18);
            }
            if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
                auVar13._12_4_ <= auVar11._12_4_) {
              *plVar7 = (long)((long)pvVar4 + (lVar6 + 1) * 0x18);
            }
            auVar12._0_8_ = auVar12._0_8_ + 2;
            auVar12._8_8_ = lVar6 + 2;
            plVar7 = plVar7 + 6;
            uVar5 = uVar5 - 2;
          } while (uVar5 != 0);
        }
        *(void **)((long)packet + 0x120) = pvVar4;
        *(void **)((long)packet + 0x128) = pvVar4;
        *(uint *)((long)packet + 0x5c) = uVar10;
        goto LAB_001350ad;
      }
    }
    MVar8 = MPP_NOK;
  }
  return MVar8;
}

Assistant:

MPP_RET mpp_packet_add_segment_info(MppPacket packet, RK_S32 type, RK_S32 offset, RK_S32 len)
{
    MppPacketImpl *p = (MppPacketImpl *)packet;
    RK_U32 old_buf_cnt = p->segment_buf_cnt;
    RK_U32 segment_nb  = p->segment_nb;
    MppPktSeg *seg_buf = p->segments;

    if (segment_nb >= old_buf_cnt) {
        RK_U32 i;

        /* realloc segment info buffer. default 8 segments */
        old_buf_cnt *= 2;

        if (NULL == p->segments_ext) {
            seg_buf = mpp_calloc(MppPktSeg, old_buf_cnt);
            if (seg_buf)
                memcpy(seg_buf, p->segments_def, sizeof(p->segments_def));
        } else {
            seg_buf = mpp_realloc(p->segments_ext, MppPktSeg, old_buf_cnt);
        }

        if (NULL == seg_buf)
            return MPP_NOK;

        for (i = 0; i < segment_nb - 1; i++)
            seg_buf[i].next = &seg_buf[i + 1];

        p->segments_ext = seg_buf;
        p->segments = seg_buf;
        p->segment_buf_cnt = old_buf_cnt;
    } else {
        if (NULL == seg_buf) {
            seg_buf = p->segments_def;
            p->segments = seg_buf;
        }
    }

    mpp_assert(seg_buf);
    seg_buf += segment_nb;
    seg_buf->index  = segment_nb;
    seg_buf->type   = type;
    seg_buf->offset = offset;
    seg_buf->len    = len;
    seg_buf->next   = NULL;

    if (segment_nb)
        seg_buf[-1].next = seg_buf;

    p->segment_nb++;
    mpp_assert(p->segment_nb <= p->segment_buf_cnt);

    return MPP_OK;
}